

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minReLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,int leave,
            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,bool polish)

{
  uint *puVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar2;
  pointer pnVar3;
  undefined8 uVar4;
  int iVar5;
  Status SVar6;
  pointer pnVar7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *to;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_218;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  uint local_198 [3];
  undefined3 uStack_18b;
  undefined5 uStack_188;
  undefined8 local_180;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  if (leave < 0) goto LAB_0047e766;
  pSVar8 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pUVar2 = pSVar8->theFvec;
  pnVar7 = (pSVar8->theUBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pnVar7[(uint)leave].m_backend.fpclass == cpp_dec_float_NaN) ||
     (pnVar3 = (pSVar8->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     pnVar3[(uint)leave].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_0047e69c:
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)sel,0.0);
    if (polish) goto LAB_0047e766;
    pnVar7 = (pUVar2->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[(uint)leave].m_backend;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar7[(uint)leave].m_backend + 8);
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x10);
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x18);
    local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x20);
    local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x28);
    local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x30);
    local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x38);
    local_128.m_backend.exp = *(int *)((long)(pnVar7 + (uint)leave) + 0x40);
    local_128.m_backend.neg = *(bool *)((long)(pnVar7 + (uint)leave) + 0x44);
    local_128.m_backend._72_8_ = *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x48);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shiftLBbound((this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver,leave,&local_128);
    pSVar8 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar7 = (pUVar2->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = *(undefined8 *)&pnVar7[(uint)leave].m_backend;
    uVar10 = *(undefined8 *)((long)&pnVar7[(uint)leave].m_backend + 8);
    uVar4 = pnVar7 + (uint)leave;
    uVar11 = *(uint *)(uVar4 + 0x10);
    uVar12 = *(uint *)(uVar4 + 0x14);
    uVar13 = *(uint *)(uVar4 + 0x18);
    uVar14 = *(uint *)(uVar4 + 0x1c);
    uVar4 = pnVar7 + (uint)leave;
    uVar15 = *(uint *)(uVar4 + 0x20);
    uVar16 = *(uint *)(uVar4 + 0x24);
    uVar17 = *(uint *)(uVar4 + 0x28);
    uVar18 = *(uint *)(uVar4 + 0x2c);
    uVar4 = pnVar7 + (uint)leave;
    uVar19 = *(uint *)(uVar4 + 0x30);
    uVar20 = *(uint *)(uVar4 + 0x34);
    uVar21 = *(uint *)(uVar4 + 0x38);
    uVar22 = *(uint *)(uVar4 + 0x3c);
    to = &local_178;
  }
  else {
    iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&pnVar7[(uint)leave].m_backend,&pnVar3[(uint)leave].m_backend);
    if (iVar5 < 1) goto LAB_0047e69c;
    pnVar7 = (pUVar2->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_218.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[(uint)leave].m_backend.data;
    local_218.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar7[(uint)leave].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar7[(uint)leave].m_backend.data + 0x10);
    local_218.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_218.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar7[(uint)leave].m_backend.data + 0x20);
    local_218.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_218.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar7[(uint)leave].m_backend.data + 0x30);
    local_218.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_218.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_218.exp = pnVar7[(uint)leave].m_backend.exp;
    local_218.neg = pnVar7[(uint)leave].m_backend.neg;
    uVar9._0_4_ = pnVar7[(uint)leave].m_backend.fpclass;
    uVar9._4_4_ = pnVar7[(uint)leave].m_backend.prec_elem;
    local_180._0_4_ = cpp_dec_float_finite;
    local_180._4_4_ = 0x10;
    local_1c8 = ZEXT816(0);
    local_1b8 = ZEXT816(0);
    local_1a8 = ZEXT816(0);
    local_198[0] = 0;
    local_198[1] = 0;
    stack0xfffffffffffffe70 = 0;
    uStack_18b = 0;
    uStack_188._0_4_ = 0;
    uStack_188._4_1_ = false;
    local_218._72_8_ = uVar9;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((cpp_dec_float<100U,_int,_void> *)local_1c8,&(this->fastDelta).m_backend,
               &maxabs->m_backend);
    if (((sel->m_backend).fpclass == cpp_dec_float_NaN) ||
       ((fpclass_type)local_180 == cpp_dec_float_NaN)) goto LAB_0047e766;
    iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&sel->m_backend,(cpp_dec_float<100U,_int,_void> *)local_1c8);
    if (iVar5 < 1) goto LAB_0047e766;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)sel,0.0);
    if (polish) goto LAB_0047e766;
    pSVar8 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    SVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dualStatus(&pSVar8->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ,(pSVar8->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).theBaseId.data + (uint)leave);
    if (SVar6 == D_ON_BOTH) goto LAB_0047e766;
    if ((fpclass_type)uVar9 != cpp_dec_float_NaN) {
      local_180._0_4_ = cpp_dec_float_finite;
      local_180._4_4_ = 0x10;
      local_1c8 = (undefined1  [16])0x0;
      local_1b8 = (undefined1  [16])0x0;
      local_1a8 = (undefined1  [16])0x0;
      local_198[0] = 0;
      local_198[1] = 0;
      stack0xfffffffffffffe70 = 0;
      uStack_18b = 0;
      uStack_188._0_4_ = 0;
      uStack_188._4_1_ = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_1c8,0.0);
      iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                        (&local_218,(cpp_dec_float<100U,_int,_void> *)local_1c8);
      if (0 < iVar5) {
        pnVar7 = (pUVar2->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[(uint)leave].m_backend;
        local_88.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&pnVar7[(uint)leave].m_backend + 8);
        local_88.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x10);
        local_88.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x18);
        local_88.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x20);
        local_88.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x28);
        local_88.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x30);
        local_88.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x38);
        local_88.m_backend.exp = *(int *)((long)(pnVar7 + (uint)leave) + 0x40);
        local_88.m_backend.neg = *(bool *)((long)(pnVar7 + (uint)leave) + 0x44);
        local_88.m_backend._72_8_ = *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x48);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::shiftLBbound((this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver,leave,&local_88);
        goto LAB_0047e766;
      }
    }
    pSVar8 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar7 = (pUVar2->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = *(undefined8 *)&pnVar7[(uint)leave].m_backend;
    uVar10 = *(undefined8 *)((long)&pnVar7[(uint)leave].m_backend + 8);
    uVar4 = pnVar7 + (uint)leave;
    uVar11 = *(uint *)(uVar4 + 0x10);
    uVar12 = *(uint *)(uVar4 + 0x14);
    uVar13 = *(uint *)(uVar4 + 0x18);
    uVar14 = *(uint *)(uVar4 + 0x1c);
    uVar4 = pnVar7 + (uint)leave;
    uVar15 = *(uint *)(uVar4 + 0x20);
    uVar16 = *(uint *)(uVar4 + 0x24);
    uVar17 = *(uint *)(uVar4 + 0x28);
    uVar18 = *(uint *)(uVar4 + 0x2c);
    uVar4 = pnVar7 + (uint)leave;
    uVar19 = *(uint *)(uVar4 + 0x30);
    uVar20 = *(uint *)(uVar4 + 0x34);
    uVar21 = *(uint *)(uVar4 + 0x38);
    uVar22 = *(uint *)(uVar4 + 0x3c);
    to = &local_d8;
  }
  (to->m_backend).data._M_elems[0xc] = uVar19;
  (to->m_backend).data._M_elems[0xd] = uVar20;
  (to->m_backend).data._M_elems[0xe] = uVar21;
  (to->m_backend).data._M_elems[0xf] = uVar22;
  (to->m_backend).data._M_elems[8] = uVar15;
  (to->m_backend).data._M_elems[9] = uVar16;
  (to->m_backend).data._M_elems[10] = uVar17;
  (to->m_backend).data._M_elems[0xb] = uVar18;
  (to->m_backend).data._M_elems[4] = uVar11;
  (to->m_backend).data._M_elems[5] = uVar12;
  (to->m_backend).data._M_elems[6] = uVar13;
  (to->m_backend).data._M_elems[7] = uVar14;
  *(undefined8 *)(to->m_backend).data._M_elems = uVar9;
  *(undefined8 *)((to->m_backend).data._M_elems + 2) = uVar10;
  (to->m_backend).exp = *(int *)((long)(pnVar7 + (uint)leave) + 0x40);
  (to->m_backend).neg = *(bool *)((long)(pnVar7 + (uint)leave) + 0x44);
  uVar9 = *(undefined8 *)((long)(pnVar7 + (uint)leave) + 0x48);
  (to->m_backend).fpclass = (int)uVar9;
  (to->m_backend).prec_elem = (int)((ulong)uVar9 >> 0x20);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::shiftUBbound(pSVar8,leave,to);
LAB_0047e766:
  return SUB41((uint)leave >> 0x1f,0);
}

Assistant:

bool SPxFastRT<R>::minReLeave(R& sel, int leave, R maxabs, bool polish)
{
   UpdateVector<R>& vec = this->thesolver->fVec();
   VectorBase<R>& low = this->thesolver->lbBound();
   VectorBase<R>& up = this->thesolver->ubBound();

   if(leave < 0)
      return true;

   if(up[leave] > low[leave])
   {
      R x = vec.delta()[leave];

      if(sel > fastDelta / maxabs)
      {
         sel = 0.0;

         if(!polish
               && this->thesolver->dualStatus(this->thesolver->baseId(leave)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
            // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         {
            if(x > 0.0)
               this->thesolver->shiftLBbound(leave, vec[leave]);
            else
               this->thesolver->shiftUBbound(leave, vec[leave]);
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         this->thesolver->shiftLBbound(leave, vec[leave]);
         this->thesolver->shiftUBbound(leave, vec[leave]);
      }
   }

   return false;
}